

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall Rml::Context::~Context(Context *this)

{
  Context *this_local;
  
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__Context_00814dd8;
  PluginRegistry::NotifyContextDestroy(this);
  UnloadAllDocuments(this);
  ReleaseUnloadedDocuments(this);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::reset(&this->root,(pointer)0x0);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::reset
            (&this->cursor_proxy,(pointer)0x0);
  this->instancer = (ContextInstancer *)0x0;
  ::std::unique_ptr<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_>::~unique_ptr
            (&this->default_data_type_register);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Table(&this->data_models);
  itlib::
  flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  ::~flat_set(&this->drag_hover_chain);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&this->cursor_proxy);
  ::std::__cxx11::string::~string((string *)&this->cursor_name);
  ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>::~unique_ptr
            (&this->scroll_controller);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&this->root);
  ::std::
  vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ::~vector(&this->unloaded_documents);
  ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::~vector
            (&this->document_focus_history);
  ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::~vector(&this->active_chain);
  itlib::
  flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  ::~flat_set(&this->hover_chain);
  itlib::
  flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~flat_set(&this->active_themes);
  ::std::__cxx11::string::~string((string *)&this->documents_base_tag);
  ::std::__cxx11::string::~string((string *)&this->name);
  ScriptInterface::~ScriptInterface(&this->super_ScriptInterface);
  return;
}

Assistant:

Context::~Context()
{
	PluginRegistry::NotifyContextDestroy(this);

	UnloadAllDocuments();

	ReleaseUnloadedDocuments();

	root.reset();

	cursor_proxy.reset();

	instancer = nullptr;
}